

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# data_structure.h
# Opt level: O3

index_t __thiscall
xLearn::DMatrix::GetMiniBatch(DMatrix *this,index_t batch_size,DMatrix *mini_batch)

{
  uint uVar1;
  uint uVar2;
  ulong uVar3;
  
  if (batch_size == 0) {
    uVar3 = 0;
  }
  else {
    uVar2 = this->pos;
    uVar3 = 0;
    do {
      if (this->row_length <= uVar2) goto LAB_001252a5;
      AddRow(mini_batch);
      uVar1 = this->pos;
      (mini_batch->row).
      super__Vector_base<std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_*,_std::allocator<std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_*>_>
      ._M_impl.super__Vector_impl_data._M_start[uVar3] =
           (this->row).
           super__Vector_base<std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_*,_std::allocator<std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_*>_>
           ._M_impl.super__Vector_impl_data._M_start[uVar1];
      (mini_batch->Y).super__Vector_base<float,_std::allocator<float>_>._M_impl.
      super__Vector_impl_data._M_start[uVar3] =
           (this->Y).super__Vector_base<float,_std::allocator<float>_>._M_impl.
           super__Vector_impl_data._M_start[uVar1];
      uVar2 = uVar1 + 1;
      (mini_batch->norm).super__Vector_base<float,_std::allocator<float>_>._M_impl.
      super__Vector_impl_data._M_start[uVar3] =
           (this->norm).super__Vector_base<float,_std::allocator<float>_>._M_impl.
           super__Vector_impl_data._M_start[uVar1];
      uVar3 = uVar3 + 1;
      this->pos = uVar2;
    } while (batch_size != uVar3);
    uVar3 = (ulong)batch_size;
  }
LAB_001252a5:
  return (index_t)uVar3;
}

Assistant:

index_t GetMiniBatch(index_t batch_size, DMatrix& mini_batch) {
    // Copy mini-batch
    for (index_t i = 0; i < batch_size; ++i) {
      if (this->pos >= this->row_length) {
        return i;
      }
      mini_batch.AddRow();
      mini_batch.row[i] = this->row[pos];
      mini_batch.Y[i] = this->Y[pos];
      mini_batch.norm[i] = this->norm[pos];
      this->pos++;
    }
    return batch_size;
  }